

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetFrameworkVersion_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  char *__s;
  allocator<char> local_39;
  string local_38;
  
  if (this->Target->TargetTypeValue == INTERFACE_LIBRARY) {
    __assert_fail("this->GetType() != cmStateEnums::INTERFACE_LIBRARY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x1309,"std::string cmGeneratorTarget::GetFrameworkVersion() const");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"FRAMEWORK_VERSION",&local_39);
  __s = GetProperty(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (__s == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"VERSION",&local_39);
    __s = GetProperty(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (__s == (char *)0x0) {
      __s = "A";
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

cmStateEnums::TargetType cmGeneratorTarget::GetType() const
{
  return this->Target->GetType();
}